

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void wasm::FunctionValidator::scan(FunctionValidator *self,Expression **currp)

{
  char cVar1;
  Expression *this;
  Function *pFVar2;
  Id IVar3;
  Index IVar4;
  Try *pTVar5;
  Expression **ppEVar6;
  CallRef *pCVar7;
  Call *pCVar8;
  CallIndirect *pCVar9;
  PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *this_00;
  ulong uVar10;
  AbstractChildIterator<wasm::ChildIterator> *pAVar11;
  bool bVar12;
  bool bVar13;
  Iterator IVar14;
  AbstractChildIterator<wasm::ChildIterator> local_88;
  Iterator local_48;
  Expression *local_38;
  
  this = *currp;
  local_38 = this;
  if (this->_id == TryId) {
    this_00 = &(self->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
    ;
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&this_00->
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
                doVisitTry,currp);
    pTVar5 = Expression::cast<wasm::Try>(this);
    uVar10 = (ulong)(uint)(pTVar5->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar10) {
      uVar10 = uVar10 - 1;
      ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar5->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar10);
      Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
                (&this_00->
                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 ,scan,ppEVar6);
    }
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&this_00->
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,visitPreCatch,currp);
    pTVar5 = Expression::cast<wasm::Try>(local_38);
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&this_00->
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,scan,&pTVar5->body);
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&this_00->
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,visitPreTry,currp);
    return;
  }
  PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::scan
            (self,currp);
  IVar3 = this->_id;
  if (IVar3 == BlockId) {
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                ).
                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                .
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,visitPreBlock,currp);
    IVar3 = this->_id;
  }
  if (IVar3 == LoopId) {
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                ).
                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                .
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,visitPreLoop,currp);
  }
  pFVar2 = (self->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
           ).
           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           currFunction;
  if ((pFVar2 != (Function *)0x0) && (pFVar2->profile == Poppy)) {
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                ).
                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                .
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,visitPoppyExpression,currp);
  }
  if ((this->type).id != 1) {
    return;
  }
  IVar3 = this->_id;
  uVar10 = (ulong)IVar3;
  if (uVar10 < 0x3e) {
    if ((0x1c0000000880000U >> (uVar10 & 0x3f) & 1) != 0) {
      return;
    }
    if (uVar10 == 7) {
      pCVar9 = Expression::cast<wasm::CallIndirect>(this);
      cVar1 = pCVar9->isReturn;
    }
    else {
      if (uVar10 != 0x3d) goto LAB_00d107b5;
      pCVar7 = Expression::cast<wasm::CallRef>(this);
      cVar1 = pCVar7->isReturn;
    }
  }
  else {
LAB_00d107b5:
    if (IVar3 - 4 < 2) {
      return;
    }
    if (IVar3 != CallId) goto LAB_00d107e7;
    pCVar8 = Expression::cast<wasm::Call>(this);
    cVar1 = pCVar8->isReturn;
  }
  if (cVar1 != '\0') {
    return;
  }
LAB_00d107e7:
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_88,this);
  local_48.index = 0;
  local_48.parent = &local_88;
  IVar14 = AbstractChildIterator<wasm::ChildIterator>::end(&local_88);
  IVar4 = 0;
  pAVar11 = &local_88;
  while ((bVar12 = IVar4 != IVar14.index, bVar13 = pAVar11 != IVar14.parent, bVar13 || bVar12 &&
         (ppEVar6 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_48),
         ((*ppEVar6)->type).id != 1))) {
    IVar4 = local_48.index + 1;
    pAVar11 = local_48.parent;
    local_48.index = IVar4;
  }
  std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
            (&local_88.children.flexible.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>);
  shouldBeTrue<wasm::Expression*>
            (self,bVar13 || bVar12,local_38,"unreachable instruction must have unreachable child");
  return;
}

Assistant:

static void scan(FunctionValidator* self, Expression** currp) {
    auto* curr = *currp;
    // Treat 'Try' specially because we need to run visitPreCatch between the
    // try body and catch bodies
    if (curr->is<Try>()) {
      self->pushTask(doVisitTry, currp);
      auto& list = curr->cast<Try>()->catchBodies;
      for (int i = int(list.size()) - 1; i >= 0; i--) {
        self->pushTask(scan, &list[i]);
      }
      self->pushTask(visitPreCatch, currp);
      self->pushTask(scan, &curr->cast<Try>()->body);
      self->pushTask(visitPreTry, currp);
      return;
    }

    PostWalker<FunctionValidator>::scan(self, currp);

    if (curr->is<Block>()) {
      self->pushTask(visitPreBlock, currp);
    }
    if (curr->is<Loop>()) {
      self->pushTask(visitPreLoop, currp);
    }
    if (auto* func = self->getFunction()) {
      if (func->profile == IRProfile::Poppy) {
        self->pushTask(visitPoppyExpression, currp);
      }
    }

    // Also verify that only allowed expressions end up in the situation where
    // the expression has type unreachable but there is no unreachable child.
    // For example a Call with no unreachable child cannot be unreachable, but a
    // Break can be.
    if (curr->type == Type::unreachable) {
      switch (curr->_id) {
        case Expression::BreakId: {
          // If there is a condition, that is already validated fully in
          // visitBreak(). If there isn't a condition, then this is allowed to
          // be unreachable even without an unreachable child. Either way, we
          // can leave.
          return;
        }
        case Expression::SwitchId:
        case Expression::ReturnId:
        case Expression::UnreachableId:
        case Expression::ThrowId:
        case Expression::RethrowId:
        case Expression::ThrowRefId: {
          // These can all be unreachable without an unreachable child.
          return;
        }
        case Expression::CallId: {
          if (curr->cast<Call>()->isReturn) {
            return;
          }
          break;
        }
        case Expression::CallIndirectId: {
          if (curr->cast<CallIndirect>()->isReturn) {
            return;
          }
          break;
        }
        case Expression::CallRefId: {
          if (curr->cast<CallRef>()->isReturn) {
            return;
          }
          break;
        }
        default: {
          break;
        }
      }

      // If we reach here, then we must have an unreachable child.
      bool hasUnreachableChild = false;
      for (auto* child : ChildIterator(curr)) {
        if (child->type == Type::unreachable) {
          hasUnreachableChild = true;
          break;
        }
      }
      self->shouldBeTrue(hasUnreachableChild,
                         curr,
                         "unreachable instruction must have unreachable child");
    }
  }